

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bool filemgr_is_commit_header(void *head_buffer,size_t blocksize)

{
  ulong uVar1;
  long in_RSI;
  long in_RDI;
  filemgr_magic_t magic;
  uint8_t marker [1];
  undefined1 local_1;
  
  if (*(char *)(in_RDI + -1 + in_RSI) == -0x12) {
    uVar1 = *(ulong *)(in_RDI + -9 + in_RSI);
    local_1 = ver_is_valid_magic(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                                 (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool filemgr_is_commit_header(void *head_buffer, size_t blocksize)
{
    uint8_t marker[BLK_MARKER_SIZE];
    filemgr_magic_t magic;
    marker[0] = *(((uint8_t *)head_buffer)
                 + blocksize - BLK_MARKER_SIZE);
    if (marker[0] != BLK_MARKER_DBHEADER) {
        return false;
    }

    memcpy(&magic, (uint8_t *) head_buffer
            + blocksize - BLK_MARKER_SIZE - sizeof(magic), sizeof(magic));
    magic = _endian_decode(magic);

    return ver_is_valid_magic(magic);
}